

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  uint uVar3;
  int iVar4;
  byte *str;
  byte *pbVar5;
  long lVar6;
  xmlChar *pxVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int l;
  int local_58;
  uint local_54;
  byte *local_50;
  int local_44;
  xmlParserInputPtr local_40;
  xmlChar **local_38;
  
  local_44 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    local_44 = 10000000;
  }
  local_50 = (byte *)0x0;
  bVar1 = *ctxt->input->cur;
  uVar3 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    uVar3 = 0x27;
  }
  str = (byte *)(*xmlMallocAtomic)(100);
  if (str == (byte *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_ENTITY_VALUE;
  local_40 = ctxt->input;
  if (((ctxt->progressive == 0) && ((long)local_40->end - (long)local_40->cur < 0xfa)) &&
     (xmlGROW(ctxt), ctxt->instate == XML_PARSER_EOF)) {
LAB_001587ab:
    pxVar7 = (xmlChar *)0x0;
    goto LAB_001587f1;
  }
  local_54 = uVar3;
  local_38 = orig;
  xmlNextChar(ctxt);
  uVar3 = xmlCurrentChar(ctxt,&local_58);
  iVar8 = 0;
  iVar10 = 100;
  do {
    uVar9 = uVar3;
    if ((int)uVar3 < 0x100) {
      if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0))))
      goto LAB_001585b4;
LAB_00158710:
      str[iVar8] = 0;
      if (ctxt->instate == XML_PARSER_EOF) goto LAB_001587ab;
      if (uVar9 == local_54) {
        xmlNextChar(ctxt);
        local_50 = str;
        goto LAB_00158745;
      }
      pxVar7 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_FINISHED,(char *)0x0);
      goto LAB_001587f1;
    }
    if (0xfffff < uVar3 - 0x10000 && (0x1ffd < uVar3 - 0xe000 && 0xd7ff < uVar3)) goto LAB_00158710;
LAB_001585b4:
    if (((uVar3 == local_54) && (uVar9 = local_54, ctxt->input == local_40)) ||
       (uVar9 = uVar3, ctxt->instate == XML_PARSER_EOF)) goto LAB_00158710;
    pbVar5 = str;
    if (iVar10 <= iVar8 + 5) {
      iVar10 = iVar10 * 2;
      pbVar5 = (byte *)(*xmlRealloc)(str,(long)iVar10);
      if (pbVar5 == (byte *)0x0) {
        pxVar7 = (xmlChar *)0x0;
        xmlErrMemory(ctxt,(char *)0x0);
        goto LAB_001587ec;
      }
    }
    if (local_58 == 1) {
      lVar6 = (long)iVar8;
      iVar8 = iVar8 + 1;
      pbVar5[lVar6] = (byte)uVar3;
    }
    else {
      iVar4 = xmlCopyCharMultiByte(pbVar5 + iVar8,uVar3);
      iVar8 = iVar4 + iVar8;
    }
    pxVar2 = ctxt->input;
    if (*pxVar2->cur == '\n') {
      pxVar2->line = pxVar2->line + 1;
      pxVar2->col = 1;
    }
    else {
      pxVar2->col = pxVar2->col + 1;
    }
    pxVar7 = pxVar2->cur + local_58;
    pxVar2->cur = pxVar7;
    if ((ctxt->progressive == 0) && ((long)pxVar2->end - (long)pxVar7 < 0xfa)) {
      xmlGROW(ctxt);
    }
    uVar3 = xmlCurrentChar(ctxt,&local_58);
    if (uVar3 == 0) {
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
      uVar3 = xmlCurrentChar(ctxt,&local_58);
    }
    str = pbVar5;
  } while (iVar8 <= local_44);
  xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_NOT_FINISHED,"entity value too long\n");
  pxVar7 = (xmlChar *)0x0;
LAB_001587ec:
  if (str == (byte *)0x0) {
    return pxVar7;
  }
LAB_001587f1:
  (*xmlFree)(str);
  return pxVar7;
LAB_00158745:
  bVar1 = *local_50;
  uVar3 = (uint)bVar1;
  if (bVar1 == 0x25) {
LAB_00158766:
    local_50 = local_50 + 1;
    pxVar7 = xmlParseStringName(ctxt,&local_50);
    if ((pxVar7 == (xmlChar *)0x0) || ((*xmlFree)(pxVar7), *local_50 != 0x3b)) {
      xmlFatalErrMsgInt(ctxt,XML_ERR_ENTITY_CHAR_ERROR,
                        "EntityValue: \'%c\' forbidden except for entities references\n",uVar3);
      pxVar7 = (xmlChar *)0x0;
      goto LAB_001587ec;
    }
    if (((uVar3 == 0x25) && (ctxt->inSubset == 1)) && (ctxt->inputNr == 1)) {
      pxVar7 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,XML_ERR_ENTITY_PE_INTERNAL,(char *)0x0);
      goto LAB_001587ec;
    }
  }
  else if (bVar1 == 0x26) {
    if (local_50[1] != 0x23) goto LAB_00158766;
  }
  else if (uVar3 == 0) goto LAB_0015880f;
  local_50 = local_50 + 1;
  goto LAB_00158745;
LAB_0015880f:
  ctxt->depth = ctxt->depth + 1;
  pxVar7 = xmlStringDecodeEntities(ctxt,str,2,'\0','\0','\0');
  ctxt->depth = ctxt->depth + -1;
  if (local_38 != (xmlChar **)0x0) {
    *local_38 = str;
    return pxVar7;
  }
  goto LAB_001587ec;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int c, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;
    xmlChar stop;
    xmlChar *ret = NULL;
    const xmlChar *cur = NULL;
    xmlParserInputPtr input;

    if (RAW == '"') stop = '"';
    else if (RAW == '\'') stop = '\'';
    else {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }

    /*
     * The content of the entity definition is copied in a buffer.
     */

    ctxt->instate = XML_PARSER_ENTITY_VALUE;
    input = ctxt->input;
    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    NEXT;
    c = CUR_CHAR(l);
    /*
     * NOTE: 4.4.5 Included in Literal
     * When a parameter entity reference appears in a literal entity
     * value, ... a single or double quote character in the replacement
     * text is always treated as a normal data character and will not
     * terminate the literal.
     * In practice it means we stop the loop only when back at parsing
     * the initial entity and the quote is found
     */
    while (((IS_CHAR(c)) && ((c != stop) || /* checked */
	    (ctxt->input != input))) && (ctxt->instate != XML_PARSER_EOF)) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
                goto error;
	    }
	    buf = tmp;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);

	GROW;
	c = CUR_CHAR(l);
	if (c == 0) {
	    GROW;
	    c = CUR_CHAR(l);
	}

        if (len > maxLength) {
            xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_NOT_FINISHED,
                           "entity value too long\n");
            goto error;
        }
    }
    buf[len] = 0;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    if (c != stop) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
        goto error;
    }
    NEXT;

    /*
     * Raise problem w.r.t. '&' and '%' being used in non-entities
     * reference constructs. Note Charref will be handled in
     * xmlStringDecodeEntities()
     */
    cur = buf;
    while (*cur != 0) { /* non input consuming */
	if ((*cur == '%') || ((*cur == '&') && (cur[1] != '#'))) {
	    xmlChar *name;
	    xmlChar tmp = *cur;
            int nameOk = 0;

	    cur++;
	    name = xmlParseStringName(ctxt, &cur);
            if (name != NULL) {
                nameOk = 1;
                xmlFree(name);
            }
            if ((nameOk == 0) || (*cur != ';')) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
	    "EntityValue: '%c' forbidden except for entities references\n",
	                          tmp);
                goto error;
	    }
	    if ((tmp == '%') && (ctxt->inSubset == 1) &&
		(ctxt->inputNr == 1)) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                goto error;
	    }
	    if (*cur == 0)
	        break;
	}
	cur++;
    }

    /*
     * Then PEReference entities are substituted.
     *
     * NOTE: 4.4.7 Bypassed
     * When a general entity reference appears in the EntityValue in
     * an entity declaration, it is bypassed and left as is.
     * so XML_SUBSTITUTE_REF is not set here.
     */
    ++ctxt->depth;
    ret = xmlStringDecodeEntities(ctxt, buf, XML_SUBSTITUTE_PEREF,
                                  0, 0, 0);
    --ctxt->depth;
    if (orig != NULL) {
        *orig = buf;
        buf = NULL;
    }

error:
    if (buf != NULL)
        xmlFree(buf);
    return(ret);
}